

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFCommentWriter.cpp
# Opt level: O1

EStatusCodeAndObjectIDType __thiscall
PDFCommentWriter::WriteCommentsTree
          (PDFCommentWriter *this,PDFComment *inComment,
          PDFCommentToObjectIDTypeMap *inCommentsContext)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  EStatusCode EVar3;
  ObjectsContext *pOVar4;
  _Base_ptr p_Var5;
  DictionaryContext *this_00;
  string *psVar6;
  uchar *puVar7;
  Trace *this_01;
  ulong uVar8;
  _Base_ptr p_Var9;
  long lVar11;
  char *inFormat;
  bool bVar12;
  EStatusCodeAndObjectIDType EVar13;
  undefined1 local_60 [32];
  ObjectsContext *local_40;
  pointer local_38;
  pointer pcVar10;
  
  p_Var1 = &(inCommentsContext->_M_t)._M_impl.super__Rb_tree_header;
  p_Var5 = (inCommentsContext->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var9 = &p_Var1->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0;
      p_Var5 = (&p_Var5->_M_left)[*(PDFComment **)(p_Var5 + 1) < inComment]) {
    if (*(PDFComment **)(p_Var5 + 1) >= inComment) {
      p_Var9 = p_Var5;
    }
  }
  p_Var5 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var9 != p_Var1) &&
     (p_Var5 = p_Var9, inComment < *(PDFComment **)(p_Var9 + 1))) {
    p_Var5 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var5 == p_Var1) {
    if (inComment->ReplyTo == (PDFComment *)0x0) {
      pcVar10 = (pointer)0x0;
    }
    else {
      EVar13 = WriteCommentsTree(this,inComment->ReplyTo,inCommentsContext);
      pcVar10 = (pointer)EVar13.second;
      p_Var5 = (_Base_ptr)0x0;
      bVar12 = EVar13.first != eSuccess;
      if (bVar12) {
        uVar8 = (ulong)-(uint)bVar12;
        goto LAB_00196893;
      }
    }
    pOVar4 = PDFWriter::GetObjectsContext(this->mPDFWriter);
    p_Var5 = (_Base_ptr)ObjectsContext::StartNewIndirectObject(pOVar4);
    if (p_Var5 == (_Base_ptr)0x0) {
      this_01 = Trace::DefaultTrace();
      inFormat = "PDFCommentWriter::WriteCommentsTree, Exception in starting comment dictionary";
    }
    else {
      local_40 = pOVar4;
      this_00 = ObjectsContext::StartDictionary(pOVar4);
      pcVar2 = local_60 + 0x10;
      local_60._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"Type","");
      DictionaryContext::WriteKey(this_00,(string *)local_60);
      if ((pointer)local_60._0_8_ != pcVar2) {
        operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
      }
      local_60._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"Annot","");
      DictionaryContext::WriteNameValue(this_00,(string *)local_60);
      if ((pointer)local_60._0_8_ != pcVar2) {
        operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
      }
      local_60._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"Subtype","");
      DictionaryContext::WriteKey(this_00,(string *)local_60);
      if ((pointer)local_60._0_8_ != pcVar2) {
        operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
      }
      local_60._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"Text","");
      DictionaryContext::WriteNameValue(this_00,(string *)local_60);
      if ((pointer)local_60._0_8_ != pcVar2) {
        operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
      }
      local_60._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"Rect","");
      DictionaryContext::WriteKey(this_00,(string *)local_60);
      local_38 = pcVar10;
      if ((pointer)local_60._0_8_ != pcVar2) {
        operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
      }
      PDFRectangle::PDFRectangle
                ((PDFRectangle *)local_60,inComment->FrameBoundings[0],inComment->FrameBoundings[1],
                 inComment->FrameBoundings[2],inComment->FrameBoundings[3]);
      DictionaryContext::WriteRectangleValue(this_00,(PDFRectangle *)local_60);
      PDFRectangle::~PDFRectangle((PDFRectangle *)local_60);
      local_60._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"Contents","");
      DictionaryContext::WriteKey(this_00,(string *)local_60);
      if ((pointer)local_60._0_8_ != pcVar2) {
        operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
      }
      PDFTextString::PDFTextString((PDFTextString *)local_60,&inComment->Text);
      psVar6 = PDFTextString::ToString_abi_cxx11_((PDFTextString *)local_60);
      DictionaryContext::WriteLiteralStringValue(this_00,psVar6);
      PDFTextString::~PDFTextString((PDFTextString *)local_60);
      local_60._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"C","");
      DictionaryContext::WriteKey(this_00,(string *)local_60);
      if ((pointer)local_60._0_8_ != pcVar2) {
        operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
      }
      pOVar4 = local_40;
      ObjectsContext::StartArray(local_40);
      if ((inComment->Color).UseCMYK == true) {
        ObjectsContext::WriteDouble
                  (pOVar4,(double)(inComment->Color).CMYKComponents[0] / 255.0,eTokenSeparatorSpace)
        ;
        ObjectsContext::WriteDouble
                  (pOVar4,(double)(inComment->Color).CMYKComponents[1] / 255.0,eTokenSeparatorSpace)
        ;
        puVar7 = (inComment->Color).CMYKComponents + 2;
        lVar11 = 0x67;
      }
      else {
        ObjectsContext::WriteDouble
                  (pOVar4,(double)(inComment->Color).RGBComponents[0] / 255.0,eTokenSeparatorSpace);
        puVar7 = (inComment->Color).RGBComponents + 1;
        lVar11 = 99;
      }
      ObjectsContext::WriteDouble(pOVar4,(double)*puVar7 / 255.0,eTokenSeparatorSpace);
      ObjectsContext::WriteDouble
                (pOVar4,(double)*(byte *)((long)inComment->FrameBoundings + lVar11 + -0x40) / 255.0,
                 eTokenSeparatorSpace);
      ObjectsContext::EndArray(pOVar4,eTokenSeparatorEndLine);
      pcVar10 = local_60 + 0x10;
      local_60._0_8_ = pcVar10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"T","");
      DictionaryContext::WriteKey(this_00,(string *)local_60);
      if ((pointer)local_60._0_8_ != pcVar10) {
        operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
      }
      PDFTextString::PDFTextString((PDFTextString *)local_60,&inComment->CommentatorName);
      psVar6 = PDFTextString::ToString_abi_cxx11_((PDFTextString *)local_60);
      DictionaryContext::WriteLiteralStringValue(this_00,psVar6);
      PDFTextString::~PDFTextString((PDFTextString *)local_60);
      local_60._0_8_ = pcVar10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"M","");
      DictionaryContext::WriteKey(this_00,(string *)local_60);
      if ((pointer)local_60._0_8_ != pcVar10) {
        operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
      }
      PDFDate::ToString_abi_cxx11_((string *)local_60,&inComment->Time);
      DictionaryContext::WriteLiteralStringValue(this_00,(string *)local_60);
      if ((pointer)local_60._0_8_ != pcVar10) {
        operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
      }
      if (inComment->ReplyTo != (PDFComment *)0x0) {
        local_60._0_8_ = pcVar10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"IRT","");
        DictionaryContext::WriteKey(this_00,(string *)local_60);
        if ((pointer)local_60._0_8_ != pcVar10) {
          operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
        }
        local_60._0_8_ = local_38;
        local_60._8_8_ = 0.0;
        DictionaryContext::WriteObjectReferenceValue(this_00,(ObjectReference *)local_60);
        local_60._0_8_ = pcVar10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"RT","");
        DictionaryContext::WriteKey(this_00,(string *)local_60);
        if ((pointer)local_60._0_8_ != pcVar10) {
          operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
        }
        local_60._0_8_ = pcVar10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"R","");
        DictionaryContext::WriteNameValue(this_00,(string *)local_60);
        if ((pointer)local_60._0_8_ != pcVar10) {
          operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
        }
      }
      local_60._0_8_ = pcVar10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"Open","");
      DictionaryContext::WriteKey(this_00,(string *)local_60);
      if ((pointer)local_60._0_8_ != pcVar10) {
        operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
      }
      DictionaryContext::WriteBooleanValue(this_00,false);
      local_60._0_8_ = pcVar10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"Name","");
      DictionaryContext::WriteKey(this_00,(string *)local_60);
      if ((pointer)local_60._0_8_ != pcVar10) {
        operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
      }
      local_60._0_8_ = pcVar10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"Comment","");
      DictionaryContext::WriteNameValue(this_00,(string *)local_60);
      if ((pointer)local_60._0_8_ != pcVar10) {
        operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
      }
      pOVar4 = local_40;
      EVar3 = ObjectsContext::EndDictionary(local_40,this_00);
      if (EVar3 == eSuccess) {
        ObjectsContext::EndIndirectObject(pOVar4);
        local_60._0_8_ = inComment;
        local_60._8_8_ = p_Var5;
        std::
        _Rb_tree<PDFComment*,std::pair<PDFComment*const,unsigned_long>,std::_Select1st<std::pair<PDFComment*const,unsigned_long>>,std::less<PDFComment*>,std::allocator<std::pair<PDFComment*const,unsigned_long>>>
        ::_M_insert_unique<std::pair<PDFComment*const,unsigned_long>>
                  ((_Rb_tree<PDFComment*,std::pair<PDFComment*const,unsigned_long>,std::_Select1st<std::pair<PDFComment*const,unsigned_long>>,std::less<PDFComment*>,std::allocator<std::pair<PDFComment*const,unsigned_long>>>
                    *)inCommentsContext,(pair<PDFComment_*const,_unsigned_long> *)local_60);
        goto LAB_00196252;
      }
      this_01 = Trace::DefaultTrace();
      inFormat = "PDFCommentWriter::WriteCommentsTree, Exception in ending comment dictionary";
    }
    Trace::TraceToLog(this_01,inFormat);
    uVar8 = 0xffffffff;
  }
  else {
    p_Var5 = p_Var5[1]._M_parent;
LAB_00196252:
    uVar8 = 0;
  }
LAB_00196893:
  EVar13.second = (unsigned_long)p_Var5;
  EVar13._0_8_ = uVar8;
  return EVar13;
}

Assistant:

EStatusCodeAndObjectIDType PDFCommentWriter::WriteCommentsTree(PDFComment* inComment,PDFCommentToObjectIDTypeMap& inCommentsContext)
{
	EStatusCodeAndObjectIDType result;
	ObjectIDType repliedTo = 0;

	// if already written, return
	PDFCommentToObjectIDTypeMap::iterator it = inCommentsContext.find(inComment);
	if(it != inCommentsContext.end())
	{
		result.first = eSuccess;
		result.second = it->second;
		return result;
	}

	// if has a referred comment, write it first
	if(inComment->ReplyTo != NULL)
	{
		EStatusCodeAndObjectIDType repliedtoResult = WriteCommentsTree(inComment->ReplyTo,inCommentsContext);

		if(repliedtoResult.first != eSuccess)
		{
			result.first = eFailure;
			result.second = 0;
			return result;
		}
		else
			repliedTo = repliedtoResult.second;
	}

	do
	{
		ObjectsContext& objectsContext = mPDFWriter->GetObjectsContext();

		// Start new InDirect object for annotation dictionary
		result.second = objectsContext.StartNewIndirectObject();
		if(result.second == 0)
		{
			result.first = eFailure;
			TRACE_LOG("PDFCommentWriter::WriteCommentsTree, Exception in starting comment dictionary");
			break;
		}
		
		DictionaryContext* dictionaryContext = objectsContext.StartDictionary();


		// Type
		dictionaryContext->WriteKey("Type");
		dictionaryContext->WriteNameValue("Annot");

		// SubType
		dictionaryContext->WriteKey("Subtype");
		dictionaryContext->WriteNameValue("Text");

		// Rect
		dictionaryContext->WriteKey("Rect");
		dictionaryContext->WriteRectangleValue(
			PDFRectangle(inComment->FrameBoundings[0],
						 inComment->FrameBoundings[1],
						 inComment->FrameBoundings[2],
						 inComment->FrameBoundings[3]));

		// Contents 
		dictionaryContext->WriteKey("Contents");
		dictionaryContext->WriteLiteralStringValue(PDFTextString(inComment->Text).ToString());

		// C (color)
		dictionaryContext->WriteKey("C");
		objectsContext.StartArray();
		if(inComment->Color.UseCMYK)
		{
			objectsContext.WriteDouble((double)inComment->Color.CMYKComponents[0]/255);
			objectsContext.WriteDouble((double)inComment->Color.CMYKComponents[1]/255);
			objectsContext.WriteDouble((double)inComment->Color.CMYKComponents[2]/255);
			objectsContext.WriteDouble((double)inComment->Color.CMYKComponents[3]/255);
		}
		else
		{
			objectsContext.WriteDouble((double)inComment->Color.RGBComponents[0]/255);
			objectsContext.WriteDouble((double)inComment->Color.RGBComponents[1]/255);
			objectsContext.WriteDouble((double)inComment->Color.RGBComponents[2]/255);
		}
		objectsContext.EndArray(eTokenSeparatorEndLine);

		// T
		dictionaryContext->WriteKey("T");
		dictionaryContext->WriteLiteralStringValue(PDFTextString(inComment->CommentatorName).ToString());
		
		// M
		dictionaryContext->WriteKey("M");
		dictionaryContext->WriteLiteralStringValue(inComment->Time.ToString());

		if(inComment->ReplyTo != NULL)
		{
			// IRT
			dictionaryContext->WriteKey("IRT");
			dictionaryContext->WriteObjectReferenceValue(repliedTo);

			// RT (we're doing always "reply" at this point, being a reply to comment
			dictionaryContext->WriteKey("RT");
			dictionaryContext->WriteNameValue("R");
		}

		// Open (we'll have them all closed to begin with)
		dictionaryContext->WriteKey("Open");
		dictionaryContext->WriteBooleanValue(false);

		// Name
		dictionaryContext->WriteKey("Name");
		dictionaryContext->WriteNameValue("Comment");

		if(objectsContext.EndDictionary(dictionaryContext) != eSuccess)
		{
			result.first = eFailure;
			TRACE_LOG("PDFCommentWriter::WriteCommentsTree, Exception in ending comment dictionary");
			break;
		}
		objectsContext.EndIndirectObject();
	
		inCommentsContext.insert(PDFCommentToObjectIDTypeMap::value_type(inComment,result.second));

		result.first = eSuccess;
	}while(false);
	
	return result;
}